

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

Am_Wrapper * __thiscall Part_Key_Store_Data::Make_Unique(Part_Key_Store_Data *this)

{
  uint uVar1;
  Am_Wrapper *pAVar2;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  pAVar2 = &this->super_Am_Wrapper;
  if (uVar1 != 1) {
    (this->super_Am_Wrapper).refs = uVar1 - 1;
    pAVar2 = (Am_Wrapper *)operator_new(0x10);
    pAVar2->refs = 1;
    (pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type = (_func_int **)&PTR_ID_002e29f8;
    *(undefined4 *)&pAVar2->field_0xc = *(undefined4 *)&(this->super_Am_Wrapper).field_0xc;
  }
  return pAVar2;
}

Assistant:

static Am_Value
from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Store_Data *store =
      (Part_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  return value;
}